

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::anon_unknown_1::average<float>
               (float *src,int sstride,int uw,int vw,float *dst,int nchan)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  float *pfVar6;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar5 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar5);
  local_38 = (float)uw;
  local_34 = vw;
  *(undefined8 *)((long)&uStack_40 + lVar5) = 0x10e9df;
  memset(__s,0,(long)nchan << 2);
  iVar4 = sstride + 3;
  if (-1 < sstride) {
    iVar4 = sstride;
  }
  iVar2 = (iVar4 >> 2) * local_34;
  if (iVar2 != 0) {
    pfVar1 = src + iVar2;
    iVar2 = nchan * (int)local_38;
    do {
      pfVar6 = src;
      if (iVar2 != 0) {
        pfVar6 = src + iVar2;
        do {
          if (0 < nchan) {
            lVar5 = 0;
            do {
              *(float *)((long)__s + lVar5) =
                   *(float *)((long)src + lVar5) + *(float *)((long)__s + lVar5);
              lVar5 = lVar5 + 4;
            } while ((ulong)(uint)nchan * 4 - lVar5 != 0);
            src = (float *)((long)src + lVar5);
          }
        } while (src != pfVar6);
      }
      src = pfVar6 + ((iVar4 >> 2) - iVar2);
    } while (src != pfVar1);
  }
  if (0 < nchan) {
    uVar3 = 0;
    do {
      dst[uVar3] = *(float *)((long)__s + uVar3 * 4) * (1.0 / (float)(local_34 * (int)local_38));
      uVar3 = uVar3 + 1;
    } while ((uint)nchan != uVar3);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }